

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_clock.c
# Opt level: O0

int nni_time_get(uint64_t *sec,uint32_t *nsec)

{
  int *piVar1;
  undefined1 local_38 [8];
  timespec ts;
  int rv;
  uint32_t *nsec_local;
  uint64_t *sec_local;
  
  ts.tv_nsec._4_4_ = clock_gettime(0,(timespec *)local_38);
  if (ts.tv_nsec._4_4_ == 0) {
    *sec = (uint64_t)local_38;
    *nsec = (uint32_t)ts.tv_sec;
    sec_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    sec_local._4_4_ = nni_plat_errno(*piVar1);
  }
  return sec_local._4_4_;
}

Assistant:

int
nni_time_get(uint64_t *sec, uint32_t *nsec)
{
	int rv;
#if defined(NNG_HAVE_TIMESPEC_GET)
	struct timespec ts;
	if ((rv = timespec_get(&ts, TIME_UTC)) == TIME_UTC) {
		*sec  = ts.tv_sec;
		*nsec = ts.tv_nsec;
		return (0);
	}
#elif defined(NNG_HAVE_CLOCK_GETTIME)
	struct timespec ts;
	if ((rv = clock_gettime(CLOCK_REALTIME, &ts)) == 0) {
		*sec  = ts.tv_sec;
		*nsec = ts.tv_nsec;
		return (0);
	}
#else
	struct timeval tv;
	if ((rv = gettimeofday(&tv, NULL)) == 0) {
		*sec  = tv.tv_sec;
		*nsec = tv.tv_usec * 1000;
		return (0);
	}
#endif
	return (nni_plat_errno(errno));
}